

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<1536U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<1536U,_unsigned_int,_void,_true>::operator+=
          (uintwide_t<1536U,_unsigned_int,_void,_true> *this,
          uintwide_t<1536U,_unsigned_int,_void,_true> *other)

{
  unsigned_fast_type i;
  long lVar1;
  ulong uVar2;
  uintwide_t<1536U,_unsigned_int,_void,_true> self;
  uint local_c8 [48];
  
  if (this == other) {
    memcpy(local_c8,other,0xc0);
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = (ulong)local_c8[lVar1] +
              (this->values).super_array<unsigned_int,_48UL>.elems[lVar1] + uVar2;
      (this->values).super_array<unsigned_int,_48UL>.elems[lVar1] = (value_type_conflict)uVar2;
      uVar2 = uVar2 >> 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x30);
  }
  else {
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = (ulong)(other->values).super_array<unsigned_int,_48UL>.elems[lVar1] +
              (this->values).super_array<unsigned_int,_48UL>.elems[lVar1] + uVar2;
      (this->values).super_array<unsigned_int,_48UL>.elems[lVar1] = (value_type_conflict)uVar2;
      uVar2 = uVar2 >> 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x30);
  }
  return this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }